

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdStoreFloat(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86XmmReg reg1;
  
  reg1 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_cvtsd2ss,reg1,sQWORD,rEBX,cmd._0_4_ >> 5 & 0x7f8);
  GenCodeStoreFloatToPointer(ctx,rEAX,reg1,cmd.rC,cmd.argument);
  return;
}

Assistant:

void GenCodeCmdStoreFloat(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86XmmReg temp = ctx.ctx.GetXmmReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, temp, sQWORD, rREG, cmd.rA * 8); // Load value

	GenCodeStoreFloatToPointer(ctx, rRAX, temp, cmd.rC, cmd.argument);
#else
	x86XmmReg temp = ctx.ctx.GetXmmReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, temp, sQWORD, rREG, cmd.rA * 8); // Load value

	x86GenCodeStoreFloatToPointer(ctx, rEAX, temp, cmd.rC, cmd.argument);
#endif
}